

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O2

void __thiscall
kratos::DependencyVisitor::CombinationBlockVisitor::visit
          (CombinationBlockVisitor *this,AssignStmt *stmt)

{
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this_00;
  __node_base _Var1;
  __node_base _Var2;
  DepSet local_90;
  
  get_dep(&local_90,stmt->right_);
  for (_Var2._M_nxt = local_90.first._M_h._M_before_begin._M_nxt;
      _Var2._M_nxt != (_Hash_node_base *)0x0; _Var2._M_nxt = (_Var2._M_nxt)->_M_nxt) {
    std::
    _Hashtable<kratos::Var_const*,kratos::Var_const*,std::allocator<kratos::Var_const*>,std::__detail::_Identity,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::_M_emplace<kratos::Var_const*const&>
              ((_Hashtable<kratos::Var_const*,kratos::Var_const*,std::allocator<kratos::Var_const*>,std::__detail::_Identity,std::equal_to<kratos::Var_const*>,std::hash<kratos::Var_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)&this->vars_,_Var2._M_nxt + 1);
  }
  for (_Var1._M_nxt = local_90.second._M_h._M_before_begin._M_nxt;
      _Var1._M_nxt != (_Hash_node_base *)0x0; _Var1._M_nxt = (_Var1._M_nxt)->_M_nxt) {
    this_00 = (_Insert_base<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               *)std::__detail::
                 _Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_kratos::Var_*,_std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_kratos::Var_*>,_std::hash<const_kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->linked_vars_,(key_type *)(_Var1._M_nxt + 1));
    std::__detail::
    _Insert_base<unsigned_int,std::pair<unsigned_int_const,kratos::Var*>,std::allocator<std::pair<unsigned_int_const,kratos::Var*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::
    insert<std::__detail::_Node_const_iterator<std::pair<unsigned_int_const,kratos::Var*>,false,false>>
              (this_00,(_Node_const_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>
                        )_Var1._M_nxt[4]._M_nxt,
               (_Node_const_iterator<std::pair<const_unsigned_int,_kratos::Var_*>,_false,_false>)0x0
              );
  }
  std::
  pair<std::unordered_set<const_kratos::Var_*,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<const_kratos::Var_*>_>,_std::unordered_map<const_kratos::Var_*,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>,_std::hash<const_kratos::Var_*>,_std::equal_to<const_kratos::Var_*>,_std::allocator<std::pair<const_kratos::Var_*const,_std::unordered_map<unsigned_int,_kratos::Var_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>_>_>_>_>_>
  ::~pair(&local_90);
  return;
}

Assistant:

void visit(AssignStmt *stmt) override {
            auto const &[dep, linked] = DependencyVisitor::get_dep(stmt->right());
            for (auto const &var : dep) vars_.emplace(var);
            for (auto const &[var, entry] : linked) {
                linked_vars_[var].insert(entry.begin(), entry.end());
            }
        }